

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

reference __thiscall
absl::InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>::
GrowAndEmplaceBack<S2ShapeIndexCell_const*>
          (InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *this,
          S2ShapeIndexCell **args)

{
  ulong uVar1;
  S2ShapeIndexCell **ppSVar2;
  InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *pIVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  Allocation new_allocation;
  
  uVar1 = *(ulong *)this;
  uVar4 = uVar1 >> 1;
  uVar6 = 6;
  if ((uVar1 & 1) != 0) {
    uVar6 = *(ulong *)(this + 8);
  }
  if (uVar4 == uVar6) {
    ppSVar2 = __gnu_cxx::new_allocator<const_S2ShapeIndexCell_*>::allocate
                        ((new_allocator<const_S2ShapeIndexCell_*> *)this,uVar6 * 2,(void *)0x0);
    ppSVar2[uVar4] = *args;
    if (((byte)*this & 1) == 0) {
      pIVar3 = this + 8;
    }
    else {
      pIVar3 = *(InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>
                 **)(this + 0x10);
    }
    if (1 < uVar1) {
      lVar5 = 0;
      do {
        *(undefined8 *)((long)ppSVar2 + lVar5) = *(undefined8 *)(pIVar3 + lVar5);
        lVar5 = lVar5 + 8;
      } while (uVar4 * 8 - lVar5 != 0);
    }
    new_allocation.buffer_ = ppSVar2;
    new_allocation.capacity_ = uVar6 * 2;
    InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
    ResetAllocation((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                     *)this,new_allocation,uVar4 + 1);
    return ppSVar2 + uVar4;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<const S2ShapeIndexCell *, 6>::GrowAndEmplaceBack(Args &&...) [T = const S2ShapeIndexCell *, N = 6, A = std::allocator<const S2ShapeIndexCell *>, Args = <const S2ShapeIndexCell *>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }